

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int curlProgressCallback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if ((dltotal == 0.0) && (!NAN(dltotal))) {
    if (curlProgressCallback::isComplete != 0) {
      curlProgressCallback_isFirst = '\0';
    }
    curlProgressCallback::isComplete = 0;
    return 0;
  }
  dVar4 = ceil((dlnow / dltotal) * 100.0 + -0.5);
  uVar1 = (uint)dVar4;
  if ((int)uVar1 < 100 && curlProgressCallback::isComplete != 0) {
    curlProgressCallback_isFirst = '\0';
  }
  else {
    if ((curlProgressCallback::isComplete != 0) && (99 < (int)uVar1)) {
      return 0;
    }
    if (curlProgressCallback_isFirst != '\0') goto LAB_00138754;
  }
  if (clientp != (void *)0x0) {
    fwrite("Downloading ",0xc,1,_stderr);
    fputs((char *)clientp,_stderr);
    fwrite("...\n",4,1,_stderr);
  }
  curlProgressCallback_isFirst = '\x01';
LAB_00138754:
  curlProgressCallback::isComplete = (int)(99 < (int)uVar1);
  dVar4 = ceil((dlnow / dltotal) * 50.0 + -0.5);
  iVar2 = 0x32;
  if ((int)dVar4 < 0x32) {
    iVar2 = (int)dVar4;
  }
  fprintf(_stderr,"%3d%% [",(ulong)uVar1);
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  while (iVar3 != 0) {
    fputc(0x3d,_stderr);
    iVar3 = iVar3 + -1;
  }
  for (iVar2 = iVar2 + -0x32; iVar2 != 0; iVar2 = iVar2 + 1) {
    fputc(0x20,_stderr);
  }
  fwrite("]\r",2,1,_stderr);
  if (curlProgressCallback::isComplete != 0) {
    fputc(10,_stderr);
  }
  fflush(_stderr);
  return 0;
}

Assistant:

int curlProgressCallback(void *clientp, double dltotal, double dlnow,
      double ultotal, double ulnow)
{
   int i, fullBar = 50, nToDisplay = 0;
   int percent = 0;
   double fracCompleted = 0.0;
   char *urlname=0;
   static int isComplete = 0;
   static int isFirst = 1;
   
   /* isFirst is true the very first time this is entered. Afterwards it
      should get reset to true when isComplete is first detected to have 
      toggled from true to false. */
   if (dltotal == 0.0)
   {
      if (isComplete)
         isFirst = 1;
      isComplete = 0;
      return 0;
   }

   fracCompleted = dlnow/dltotal;
   percent = (int)ceil(fracCompleted*100.0 - 0.5);
   if (isComplete && percent < 100)
      isFirst = 1;
   if (!isComplete || percent < 100)
   {
      if (isFirst)
      {
         urlname = (char *)clientp;
         if (urlname)
         {
            fprintf(stderr,"Downloading ");
            fprintf(stderr,"%s",urlname);
            fprintf(stderr,"...\n");
         }
         isFirst = 0;
      }
      isComplete = (percent >= 100) ? 1 : 0;
      nToDisplay = (int)ceil(fracCompleted*fullBar - 0.5);
      /* Can dlnow ever be > dltotal?  Just in case... */
      if (nToDisplay > fullBar)
         nToDisplay = fullBar;
      fprintf(stderr,"%3d%% [",percent);
      for (i=0; i<nToDisplay; ++i)
         fprintf(stderr,"=");
      /* print remaining spaces */
      for (i=nToDisplay; i<fullBar; ++i)
         fprintf(stderr," ");
      fprintf(stderr,"]\r");
      if (isComplete)
         fprintf(stderr,"\n");
      fflush(stderr);
   }
   return 0;
}